

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> *
wasm::WATParser::anon_unknown_11::
results<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  bool bVar1;
  bool bVar2;
  string_view expected;
  undefined1 local_c8 [8];
  Result<wasm::Type> type;
  undefined1 local_80 [8];
  Result<wasm::Type> _val;
  ResultsT res;
  
  _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index = '\0';
  _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_ = 0;
  bVar2 = false;
  do {
    expected._M_str = "result";
    expected._M_len = 6;
    bVar1 = ParseInput::takeSExprStart(&ctx->in,expected);
    if (!bVar1) {
      if (bVar2) {
        *(undefined8 *)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
          .
          super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
             = _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 8) = 0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x10) = 0;
        _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index = '\0';
        _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\0';
      }
      else {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_assign_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Move_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Copy_ctor_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
                 .
                 super__Variant_storage_alias<std::vector<wasm::Type>,_wasm::WATParser::None,_wasm::WATParser::Err>
         + 0x20) = '\x01';
      }
LAB_00a7ea5d:
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
      return __return_storage_ptr__;
    }
    while( true ) {
      bVar2 = ParseInput::takeRParen(&ctx->in);
      if (bVar2) break;
      valtype<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
                ((Result<wasm::Type> *)local_c8,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)local_80,
                      (_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)local_c8);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20),
                   (string *)local_80);
        std::__detail::__variant::
        _Variant_storage<false,std::vector<wasm::Type,std::allocator<wasm::Type>>,wasm::WATParser::None,wasm::WATParser::Err>
        ::_Variant_storage<2ul,wasm::WATParser::Err>
                  ((_Variant_storage<false,std::vector<wasm::Type,std::allocator<wasm::Type>>,wasm::WATParser::None,wasm::WATParser::Err>
                    *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_80);
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_c8);
        goto LAB_00a7ea5d;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_80);
      local_80 = local_c8;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                 ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20),
                 (value_type *)local_80);
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_c8);
    }
    bVar2 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::ResultsT> results(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeResults();
  while (ctx.in.takeSExprStart("result"sv)) {
    hasAny = true;
    while (!ctx.in.takeRParen()) {
      auto type = valtype(ctx);
      CHECK_ERR(type);
      ctx.appendResult(res, *type);
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}